

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  Instruction i;
  
  luaK_exp2anyreg(fs,e);
  iVar1 = (e->u).info;
  if (e->k == VNONRELOC) {
    bVar2 = luaY_nvarstack(fs);
    if ((int)(uint)bVar2 <= iVar1) {
      fs->freereg = fs->freereg + 0xff;
    }
  }
  bVar2 = fs->freereg;
  *(uint *)&e->u = (uint)bVar2;
  e->k = VNONRELOC;
  luaK_checkstack(fs,2);
  fs->freereg = fs->freereg + '\x02';
  if (-1 < ((key->u).strval)->shrlen) {
    iVar3 = luaK_exp2K(fs,key);
    if (iVar3 != 0) {
      i = (key->u).info << 0x18 | iVar1 << 0x10 | (uint)bVar2 << 7 | 0x14;
      goto LAB_0012703c;
    }
  }
  luaK_exp2anyreg(fs,key);
  luaK_code(fs,iVar1 * 0x10000 + (uint)bVar2 * 0x80 + 0x80);
  i = (key->u).info << 0x18 | iVar1 * 0x10000 + (uint)bVar2 * 0x80 | 0xc;
LAB_0012703c:
  luaK_code(fs,i);
  if (key->k == VNONRELOC) {
    iVar1 = (key->u).info;
    bVar2 = luaY_nvarstack(fs);
    if ((int)(uint)bVar2 <= iVar1) {
      fs->freereg = fs->freereg + 0xff;
    }
  }
  return;
}

Assistant:

void luaK_self (FuncState *fs, expdesc *e, expdesc *key) {
  int ereg, base;
  luaK_exp2anyreg(fs, e);
  ereg = e->u.info;  /* register where 'e' (the receiver) was placed */
  freeexp(fs, e);
  base = e->u.info = fs->freereg;  /* base register for op_self */
  e->k = VNONRELOC;  /* self expression has a fixed register */
  luaK_reserveregs(fs, 2);  /* method and 'self' produced by op_self */
  lua_assert(key->k == VKSTR);
  /* is method name a short string in a valid K index? */
  if (strisshr(key->u.strval) && luaK_exp2K(fs, key)) {
    /* can use 'self' opcode */
    luaK_codeABCk(fs, OP_SELF, base, ereg, key->u.info, 0);
  }
  else {  /* cannot use 'self' opcode; use move+gettable */
    luaK_exp2anyreg(fs, key);  /* put method name in a register */
    luaK_codeABC(fs, OP_MOVE, base + 1, ereg, 0);  /* copy self to base+1 */
    luaK_codeABC(fs, OP_GETTABLE, base, ereg, key->u.info);  /* get method */
  }
  freeexp(fs, key);
}